

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O1

REF_STATUS ref_sort_search_dbl(REF_INT n,REF_DBL *ascending_list,REF_DBL target,REF_INT *position)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  *position = -1;
  if (n < 1) {
    return 5;
  }
  uVar3 = 0;
  if (((n != 1) && (uVar3 = 0, *ascending_list < target)) &&
     (uVar6 = n - 2, uVar3 = uVar6, target < ascending_list[(ulong)(uint)n - 1])) {
    uVar4 = (ulong)(uVar6 >> 1);
    if ((target < ascending_list[uVar4]) ||
       (uVar3 = uVar6 >> 1, ascending_list[uVar4 + 1] <= target)) {
      if (2 < n) {
        uVar5 = 0;
        do {
          uVar2 = (uint)uVar4;
          if ((((ascending_list[uVar5] <= target) &&
               (uVar3 = uVar5, target < ascending_list[(ulong)uVar5 + 1])) ||
              ((ascending_list[uVar6] <= target &&
               (uVar3 = uVar6, target < ascending_list[(long)(int)uVar6 + 1])))) ||
             ((uVar1 = uVar2, ascending_list[uVar4] <= target &&
              (uVar1 = uVar6, uVar5 = uVar2, uVar3 = uVar2, target < ascending_list[uVar4 + 1]))))
          goto LAB_001ac382;
          uVar6 = uVar1;
          uVar4 = (ulong)(uVar5 + uVar6 >> 1);
        } while ((int)uVar5 < (int)uVar6);
      }
      return 1;
    }
  }
LAB_001ac382:
  *position = uVar3;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_sort_search_dbl(REF_INT n, REF_DBL *ascending_list,
                                       REF_DBL target, REF_INT *position) {
  REF_INT lower, upper, mid;

  *position = REF_EMPTY;

  /* printf("n %d target %f [",n,target);
   * for(mid=0;mid<n;mid++)printf(" %f",ascending_list[mid]);
   * printf(" ]\n"); */

  if (n < 1) return REF_NOT_FOUND;
  if (n == 1) {
    *position = 0;
    return REF_SUCCESS;
  }
  if (target <= ascending_list[0]) {
    *position = 0;
    return REF_SUCCESS;
  }
  if (target >= ascending_list[n - 1]) {
    *position = n - 2;
    return REF_SUCCESS;
  }

  lower = 0;
  upper = n - 2;
  mid = (lower + upper) >> 1; /* fast divide by two */

  if (ascending_list[mid] <= target && target < ascending_list[mid + 1]) {
    *position = mid;
    return REF_SUCCESS;
  }

  while (lower < upper) {
    if (ascending_list[lower] <= target && target < ascending_list[lower + 1]) {
      *position = lower;
      return REF_SUCCESS;
    }
    if (ascending_list[upper] <= target && target < ascending_list[upper + 1]) {
      *position = upper;
      return REF_SUCCESS;
    }
    if (ascending_list[mid] <= target && target < ascending_list[mid + 1]) {
      *position = mid;
      return REF_SUCCESS;
    }
    if (target >= ascending_list[mid]) {
      lower = mid;
    } else {
      upper = mid;
    }
    mid = (lower + upper) >> 1;
  }

  return REF_FAILURE;
}